

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 c_v128_shl_8(c_v128 a,uint c)

{
  undefined1 auVar1 [32];
  undefined8 extraout_RDX;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  c_v128 cVar6;
  c_v128 cVar7;
  
  auVar2 = in_ZMM0._0_16_;
  if (7 < c) {
    c_v128_shl_8();
    cVar7._0_4_ = 0xff << ((byte)c & 0x1f);
    cVar7.u32[1] = 0;
    auVar3[0] = (undefined1)cVar7._0_4_;
    auVar3[1] = auVar3[0];
    auVar3[2] = auVar3[0];
    auVar3[3] = auVar3[0];
    auVar3[4] = auVar3[0];
    auVar3[5] = auVar3[0];
    auVar3[6] = auVar3[0];
    auVar3[7] = auVar3[0];
    auVar3[8] = auVar3[0];
    auVar3[9] = auVar3[0];
    auVar3[10] = auVar3[0];
    auVar3[0xb] = auVar3[0];
    auVar3[0xc] = auVar3[0];
    auVar3[0xd] = auVar3[0];
    auVar3[0xe] = auVar3[0];
    auVar3[0xf] = auVar3[0];
    auVar2 = vpsllw_avx(auVar2,ZEXT416(c));
    vpand_avx(auVar2,auVar3);
    cVar7.u64[1] = extraout_RDX;
    return cVar7;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[1];
  auVar1 = vpmovzxbd_avx2(auVar2);
  auVar1 = vpslld_avx2(auVar1,ZEXT416(c));
  auVar5 = SUB6416(ZEXT464(0xc080400),0);
  auVar2 = vpshufb_avx(auVar1._16_16_,auVar5);
  auVar4 = vpshufb_avx(auVar1._0_16_,auVar5);
  auVar3 = vpunpckldq_avx(auVar4,auVar2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a.u64[0];
  auVar1 = vpmovzxbd_avx2(auVar4);
  auVar1 = vpslld_avx2(auVar1,ZEXT416(c));
  auVar2 = vpshufb_avx(auVar1._16_16_,auVar5);
  auVar4 = vpshufb_avx(auVar1._0_16_,auVar5);
  auVar2 = vpunpckldq_avx(auVar4,auVar2);
  cVar6.u64[1] = auVar3._0_8_;
  cVar6.u64[0] = auVar2._0_8_;
  return cVar6;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = (int8_t)(a.u8[c] << n);
  return t;
}